

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

base_learner * CSOAA::csldf_setup(options_i *options,vw *all)

{
  v_array<v_hashmap<unsigned_long,_features>::hash_elem> *this;
  vw_ostream *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  vw *all_00;
  ulong uVar5;
  int iVar6;
  ldf *dat;
  pointer pcVar7;
  ulong *puVar8;
  vw_exception *pvVar9;
  base_learner *l;
  single_learner *base;
  learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar10;
  long lVar11;
  bool bVar12;
  bool *pbVar13;
  undefined **ppuVar14;
  label_parser *plVar15;
  prediction_type_t pred_type;
  byte bVar16;
  string ldf_arg;
  option_group_definition csldf_inner_options;
  size_type __dnew_6;
  option_group_definition csldf_outer_options;
  string wap_ldf;
  string ldf_override;
  string csoaa_ldf;
  size_type __dnew;
  ulong *local_3f0;
  ulong local_3e8;
  ulong local_3e0 [2];
  option_group_definition local_3d0;
  bool *local_398;
  bool *local_390;
  _func_int ***local_388;
  _func_int **local_380;
  _func_int **local_378 [2];
  _func_int ***local_368;
  _func_int **local_360;
  _func_int **local_358 [2];
  v_array<v_hashmap<unsigned_long,_features>::hash_elem> *local_348;
  vw *local_340;
  ulong local_338;
  option_group_definition local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  string local_268 [64];
  bool local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar16 = 0;
  dat = calloc_or_throw<CSOAA::ldf>(1);
  this = &(dat->label_features).dat;
  memset(dat,0,0x118);
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::resize(this,0x3ff);
  (dat->label_features).eq_data = (void *)0x0;
  (dat->label_features).last_position = 0;
  (dat->label_features).num_occupants = 0;
  (dat->label_features).equivalent = (_func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *)0x0;
  (dat->label_features).equivalent_no_data = (_func_bool_unsigned_long_ptr_unsigned_long_ptr *)0x0;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_298._0_8_ = (_func_int **)0x3c;
  local_368 = local_358;
  local_368 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)local_298);
  local_358[0] = (_func_int **)local_298._0_8_;
  builtin_strncpy((char *)((long)local_368 + 0x2c),"pendent ",8);
  builtin_strncpy((char *)((long)local_368 + 0x34),"Features",8);
  local_368[4] = (_func_int **)0x6562614c20687469;
  local_368[5] = (_func_int **)0x646e65706544206c;
  local_368[2] = (_func_int **)0x6e6961674120656e;
  local_368[3] = (_func_int **)0x77206c6c41207473;
  *(undefined4 *)local_368 = 0x74736f43;
  builtin_strncpy((char *)((long)local_368 + 4)," Sen",4);
  *(undefined4 *)(local_368 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_368 + 0xc),"ve O",4);
  local_360 = (_func_int **)local_298._0_8_;
  *(char *)((long)local_368 + local_298._0_8_) = '\0';
  local_330.m_name._M_dataplus._M_p = (pointer)&local_330.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,local_368,(char *)(local_298._0_8_ + (long)local_368));
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_330.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  local_90.field_2._M_allocated_capacity = 0x646c5f61616f7363;
  local_90.field_2._8_2_ = 0x66;
  local_90._M_string_length = 9;
  local_348 = this;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_298,&local_90,&local_2b8);
  local_228 = true;
  local_3d0.m_name._M_dataplus._M_p = (pointer)&local_3d0.m_name.field_2;
  local_3f0 = (ulong *)0x46;
  local_340 = all;
  pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_3f0);
  puVar8 = local_3f0;
  local_3d0.m_name.field_2._M_allocated_capacity = (size_type)local_3f0;
  local_3d0.m_name._M_dataplus._M_p = pcVar7;
  memcpy(pcVar7,"Use one-against-all multiclass learning with label dependent features.",0x46);
  local_3d0.m_name._M_string_length = (size_type)puVar8;
  pcVar7[(long)puVar8] = '\0';
  std::__cxx11::string::_M_assign(local_268);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_330,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_298);
  paVar2 = &local_3d0.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  local_298._0_8_ = &PTR__typed_option_002d6158;
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
  }
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0.field_2._M_allocated_capacity = 0x7265766f5f66646c;
  local_b0.field_2._8_4_ = 0x65646972;
  local_b0._M_string_length = 0xc;
  local_b0.field_2._M_local_buf[0xc] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_298,&local_b0,&local_2d8);
  local_3f0 = (ulong *)0x50;
  local_3d0.m_name._M_dataplus._M_p = (pointer)paVar2;
  pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_3f0);
  puVar8 = local_3f0;
  local_3d0.m_name.field_2._M_allocated_capacity = (size_type)local_3f0;
  local_3d0.m_name._M_dataplus._M_p = pcVar7;
  memcpy(pcVar7,"Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file",
         0x50);
  local_3d0.m_name._M_string_length = (size_type)puVar8;
  pcVar7[(long)puVar8] = '\0';
  std::__cxx11::string::_M_assign(local_268);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_330,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_298);
  paVar2 = &local_3d0.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  local_298._0_8_ = &PTR__typed_option_002d6158;
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
  }
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0.field_2._M_allocated_capacity = 0x61725f61616f7363;
  local_d0.field_2._8_2_ = 0x6b6e;
  local_d0._M_string_length = 10;
  local_d0.field_2._M_local_buf[10] = '\0';
  local_390 = &dat->rank;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_298,&local_d0,local_390);
  local_228 = true;
  local_3f0 = (ulong *)0x24;
  local_3d0.m_name._M_dataplus._M_p = (pointer)paVar2;
  local_3d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_3f0);
  local_3d0.m_name.field_2._M_allocated_capacity = (size_type)local_3f0;
  builtin_strncpy(local_3d0.m_name._M_dataplus._M_p,"Return actions sorted by score order",0x24);
  local_3d0.m_name._M_string_length = (size_type)local_3f0;
  local_3d0.m_name._M_dataplus._M_p[(long)local_3f0] = '\0';
  std::__cxx11::string::_M_assign(local_268);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_330,(typed_option<bool> *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  local_298._0_8_ = &PTR__typed_option_002d60f0;
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
  }
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0.field_2._M_allocated_capacity._0_5_ = 0x61626f7270;
  local_f0.field_2._M_allocated_capacity._5_3_ = 0x6c6962;
  local_f0.field_2._8_5_ = 0x7365697469;
  local_f0._M_string_length = 0xd;
  local_f0.field_2._M_local_buf[0xd] = '\0';
  pbVar13 = &dat->is_probabilities;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_298,&local_f0,pbVar13);
  local_228 = true;
  local_3f0 = (ulong *)0x23;
  local_3d0.m_name._M_dataplus._M_p = (pointer)paVar2;
  local_3d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_3f0);
  local_3d0.m_name.field_2._M_allocated_capacity = (size_type)local_3f0;
  builtin_strncpy(local_3d0.m_name._M_dataplus._M_p,"predict probabilites of all classes",0x23);
  local_3d0.m_name._M_string_length = (size_type)local_3f0;
  local_3d0.m_name._M_dataplus._M_p[(long)local_3f0] = '\0';
  std::__cxx11::string::_M_assign(local_268);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_330,(typed_option<bool> *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  local_298._0_8_ = &PTR__typed_option_002d60f0;
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
  }
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_298._0_8_ = (_func_int **)0x3c;
  local_388 = local_378;
  local_388 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)local_298);
  local_378[0] = (_func_int **)local_298._0_8_;
  builtin_strncpy((char *)((long)local_388 + 0x2c),"pendent ",8);
  builtin_strncpy((char *)((long)local_388 + 0x34),"Features",8);
  local_388[4] = (_func_int **)0x6562614c20687469;
  local_388[5] = (_func_int **)0x646e65706544206c;
  local_388[2] = (_func_int **)0x6e6961674120656e;
  local_388[3] = (_func_int **)0x77206c6c41207473;
  *(undefined4 *)local_388 = 0x74736f43;
  builtin_strncpy((char *)((long)local_388 + 4)," Sen",4);
  *(undefined4 *)(local_388 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_388 + 0xc),"ve O",4);
  local_380 = (_func_int **)local_298._0_8_;
  *(char *)((long)local_388 + local_298._0_8_) = '\0';
  local_3d0.m_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,local_388,(char *)(local_298._0_8_ + (long)local_388));
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = pbVar13;
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  local_110.field_2._M_allocated_capacity._0_4_ = 0x5f706177;
  local_110.field_2._M_allocated_capacity._4_3_ = 0x66646c;
  local_110._M_string_length = 7;
  local_110.field_2._M_local_buf[7] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_298,&local_110,&local_2f8);
  local_228 = true;
  local_3f0 = local_3e0;
  local_338 = 0x6b;
  puVar8 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_338);
  uVar5 = local_338;
  local_3e0[0] = local_338;
  local_3f0 = puVar8;
  memcpy(puVar8,
         "Use weighted all-pairs multiclass learning with label dependent features.  Specify singleline or multiline."
         ,0x6b);
  local_3e8 = uVar5;
  *(undefined1 *)((long)puVar8 + uVar5) = 0;
  std::__cxx11::string::_M_assign(local_268);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_3d0,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_298);
  all_00 = local_340;
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  local_298._0_8_ = &PTR__typed_option_002d6158;
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
  }
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_330);
  pp_Var3 = (_func_int **)(local_298 + 0x10);
  local_298._16_8_ = 0x646c5f61616f7363;
  local_280._M_allocated_capacity._0_2_ = 0x66;
  local_298._8_8_ = (pointer)0x9;
  local_298._0_8_ = pp_Var3;
  iVar6 = (*options->_vptr_options_i[1])(options,local_298);
  if ((_func_int **)local_298._0_8_ != pp_Var3) {
    operator_delete((void *)local_298._0_8_);
  }
  if ((char)iVar6 == '\0') {
    (**options->_vptr_options_i)(options,&local_3d0);
    local_298._8_8_ = (pointer)0x7;
    local_298._16_8_ = 0x66646c5f706177;
    local_298._0_8_ = pp_Var3;
    iVar6 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_298._0_8_ != pp_Var3) {
      operator_delete((void *)local_298._0_8_);
    }
    if ((char)iVar6 == '\0') {
      plVar10 = (learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
      goto LAB_0024cdd6;
    }
  }
  dat->all = all_00;
  dat->first_pass = true;
  local_3f0 = local_3e0;
  local_3e8 = 0;
  local_3e0[0] = local_3e0[0] & 0xffffffffffffff00;
  local_298._16_8_ = 0x646c5f61616f7363;
  local_280._M_allocated_capacity._0_2_ = 0x66;
  local_298._8_8_ = (pointer)0x9;
  local_298._0_8_ = pp_Var3;
  iVar6 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_298._0_8_ != pp_Var3) {
    operator_delete((void *)local_298._0_8_);
  }
  if ((char)iVar6 == '\0') {
    std::__cxx11::string::_M_assign((string *)&local_3f0);
    dat->is_wap = true;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_3f0);
  }
  local_298._16_8_ = 0x7265766f5f66646c;
  local_280._M_allocated_capacity._0_4_ = 0x65646972;
  local_298._8_8_ = (pointer)0xc;
  local_280._M_local_buf[4] = '\0';
  local_298._0_8_ = pp_Var3;
  iVar6 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_298._0_8_ != pp_Var3) {
    operator_delete((void *)local_298._0_8_);
  }
  if ((char)iVar6 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_3f0);
  }
  if (*local_390 == true) {
    all_00->delete_prediction = ACTION_SCORE::delete_action_scores;
  }
  ppuVar14 = &COST_SENSITIVE::cs_label;
  plVar15 = &all_00->p->lp;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    plVar15->default_label = (_func_void_void_ptr *)*ppuVar14;
    ppuVar14 = ppuVar14 + (ulong)bVar16 * -2 + 1;
    plVar15 = (label_parser *)((long)plVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  all_00->label_type = cs;
  dat->treat_as_classifier = false;
  iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
  if (iVar6 == 0) {
LAB_0024cb9b:
    bVar12 = false;
LAB_0024cb9d:
    dat->treat_as_classifier = bVar12;
    pbVar13 = local_398;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
    if (iVar6 == 0) goto LAB_0024cb9b;
    iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
    bVar12 = true;
    if (iVar6 == 0) goto LAB_0024cb9d;
    iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
    if (iVar6 == 0) goto LAB_0024cb9d;
    if (all_00->training == true) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_298 + 0x10),
                 "ldf requires either m/multiline or mc/multiline-classifier",0x3a);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                 ,0x355,&local_50);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
    pbVar13 = local_398;
    if (iVar6 == 0) {
LAB_0024cb17:
      std::__cxx11::stringstream::stringstream((stringstream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_298 + 0x10),
                 "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no longer supported"
                 ,0x79);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                 ,0x35a,&local_70);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
    if (iVar6 == 0) goto LAB_0024cb17;
    iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
    if (iVar6 == 0) goto LAB_0024cb17;
    iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
    if (iVar6 == 0) goto LAB_0024cb17;
  }
  if (*pbVar13 == true) {
    all_00->sd->report_multiclass_log_loss = true;
    (**all_00->loss->_vptr_loss_function)(local_298);
    iVar6 = std::__cxx11::string::compare(local_298);
    if (iVar6 != 0) {
      pvVar1 = &all_00->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,
                 "WARNING: --probabilities should be used only with --loss_function=logistic",0x4a);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    if (dat->treat_as_classifier == false) {
      pvVar1 = &all_00->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,
                 "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)",0x46);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    if ((_func_int **)local_298._0_8_ != pp_Var3) {
      operator_delete((void *)local_298._0_8_);
    }
  }
  all_00->p->emptylines_separate_examples = true;
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::resize(local_348,0x3ff);
  (dat->label_features).equivalent = (_func_bool_void_ptr_unsigned_long_ptr_unsigned_long_ptr *)0x0;
  (dat->label_features).default_value.values._begin = (float *)0x0;
  (dat->label_features).default_value.values._end = (float *)0x0;
  (dat->label_features).default_value.values.end_array = (float *)0x0;
  (dat->label_features).default_value.values.erase_count = 0;
  (dat->label_features).default_value.indicies._begin = (unsigned_long *)0x0;
  (dat->label_features).default_value.indicies._end = (unsigned_long *)0x0;
  (dat->label_features).default_value.indicies.end_array = (unsigned_long *)0x0;
  (dat->label_features).default_value.indicies.erase_count = 0;
  (dat->label_features).default_value.space_names._begin =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (dat->label_features).default_value.space_names._end =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (dat->label_features).default_value.space_names.end_array =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (dat->label_features).default_value.space_names.erase_count = 0;
  (dat->label_features).default_value.sum_feat_sq = 0.0;
  (dat->label_features).equivalent_no_data = LabelDict::size_t_eq;
  (dat->label_features).eq_data = (void *)0x0;
  (dat->label_features).last_position = 0;
  (dat->label_features).num_occupants = 0;
  local_298._0_8_ = (_func_int **)0x1;
  v_hashmap<unsigned_long,_features>::get(&dat->label_features,(unsigned_long *)local_298,0x5a5453c)
  ;
  pred_type = action_scores;
  if (*local_390 == false) {
    pred_type = (uint)*pbVar13 * 2 + multiclass;
  }
  dat->read_example_this_loop = 0;
  l = setup_base(all_00->options,all_00);
  base = LEARNER::as_singleline<char,char>(l);
  plVar10 = LEARNER::learner<CSOAA::ldf,std::vector<example*,std::allocator<example*>>>::
            init_learner<LEARNER::learner<char,example>>
                      (dat,base,do_actual_learning<true>,do_actual_learning<false>,1,pred_type);
  uVar4 = *(undefined8 *)(plVar10 + 0x18);
  *(undefined8 *)(plVar10 + 0x58) = uVar4;
  *(code **)(plVar10 + 0x68) = finish_multiline_example;
  *(undefined8 *)(plVar10 + 0xb8) = uVar4;
  *(undefined8 *)(plVar10 + 0xc0) = *(undefined8 *)(plVar10 + 0x20);
  *(code **)(plVar10 + 200) = finish;
  *(undefined8 *)(plVar10 + 0x88) = uVar4;
  *(undefined8 *)(plVar10 + 0x90) = *(undefined8 *)(plVar10 + 0x20);
  *(code **)(plVar10 + 0x98) = end_pass;
  all_00->cost_sensitive = (base_learner *)plVar10;
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  dat = (ldf *)0x0;
LAB_0024cdd6:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_3d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_name._M_dataplus._M_p != &local_3d0.m_name.field_2) {
    operator_delete(local_3d0.m_name._M_dataplus._M_p);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_330.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
    operator_delete(local_330.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (dat != (ldf *)0x0) {
    destroy_free<CSOAA::ldf>(dat);
  }
  return (base_learner *)plVar10;
}

Assistant:

base_learner* csldf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<ldf>();

  std::string csoaa_ldf;
  std::string ldf_override;
  std::string wap_ldf;

  option_group_definition csldf_outer_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_outer_options.add(make_option("csoaa_ldf", csoaa_ldf)
                              .keep()
                              .help("Use one-against-all multiclass learning with label dependent features."));
  csldf_outer_options.add(
      make_option("ldf_override", ldf_override)
          .help("Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file"));
  csldf_outer_options.add(make_option("csoaa_rank", ld->rank).keep().help("Return actions sorted by score order"));
  csldf_outer_options.add(
      make_option("probabilities", ld->is_probabilities).keep().help("predict probabilites of all classes"));

  option_group_definition csldf_inner_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_inner_options.add(make_option("wap_ldf", wap_ldf)
                              .keep()
                              .help("Use weighted all-pairs multiclass learning with label dependent features.  "
                                    "Specify singleline or multiline."));

  options.add_and_parse(csldf_outer_options);
  if (!options.was_supplied("csoaa_ldf"))
  {
    options.add_and_parse(csldf_inner_options);
    if (!options.was_supplied("wap_ldf"))
    {
      return nullptr;
    }
  }

  ld->all = &all;
  ld->first_pass = true;

  string ldf_arg;

  if (options.was_supplied("csoaa_ldf"))
    ldf_arg = csoaa_ldf;
  else
  {
    ldf_arg = wap_ldf;
    ld->is_wap = true;
  }
  if (options.was_supplied("ldf_override"))
    ldf_arg = ldf_override;
  if (ld->rank)
    all.delete_prediction = delete_action_scores;

  all.p->lp = COST_SENSITIVE::cs_label;
  all.label_type = label_type::cs;

  ld->treat_as_classifier = false;
  if (ldf_arg.compare("multiline") == 0 || ldf_arg.compare("m") == 0)
    ld->treat_as_classifier = false;
  else if (ldf_arg.compare("multiline-classifier") == 0 || ldf_arg.compare("mc") == 0)
    ld->treat_as_classifier = true;
  else
  {
    if (all.training)
      THROW("ldf requires either m/multiline or mc/multiline-classifier");
    if ((ldf_arg.compare("singleline") == 0 || ldf_arg.compare("s") == 0) ||
        (ldf_arg.compare("singleline-classifier") == 0 || ldf_arg.compare("sc") == 0))
      THROW(
          "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no "
          "longer supported");
  }

  if (ld->is_probabilities)
  {
    all.sd->report_multiclass_log_loss = true;
    auto loss_function_type = all.loss->getType();
    if (loss_function_type != "logistic")
      all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
    if (!ld->treat_as_classifier)
      all.trace_message << "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)" << endl;
  }

  all.p->emptylines_separate_examples = true;  // TODO: check this to be sure!!!  !ld->is_singleline;

  features fs;
  ld->label_features.init(256, fs, LabelDict::size_t_eq);
  ld->label_features.get(1, 94717244);  // TODO: figure this out
  prediction_type::prediction_type_t pred_type;

  if (ld->rank)
    pred_type = prediction_type::action_scores;
  else if (ld->is_probabilities)
    pred_type = prediction_type::prob;
  else
    pred_type = prediction_type::multiclass;

  ld->read_example_this_loop = 0;
  learner<ldf, multi_ex>& l = init_learner(ld, as_singleline(setup_base(*all.options, all)), do_actual_learning<true>,
      do_actual_learning<false>, 1, pred_type);
  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  l.set_end_pass(end_pass);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}